

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O3

void __thiscall
TPZTensor<double>::ComputeEigenvalues
          (TPZTensor<double> *this,TPZDecomposed *eigensystem,bool compute_eigenvectors)

{
  undefined8 uVar1;
  double *pdVar2;
  TPZManVector<double,_3> *pTVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  double *pdVar7;
  undefined1 *puVar8;
  byte bVar9;
  uint i;
  long lVar10;
  uint *puVar11;
  ulong uVar12;
  REAL realTol;
  double dVar13;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 local_78 [8];
  undefined1 local_70 [16];
  ulong local_60;
  undefined1 local_58 [24];
  double local_40;
  double local_38;
  undefined8 uStack_30;
  
  pdVar2 = (this->fData).super_TPZVec<double>.fStore;
  dVar13 = 0.0;
  lVar10 = 0;
  do {
    dVar13 = dVar13 + pdVar2[lVar10] * pdVar2[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 6);
  dVar13 = pdVar2[4] * pdVar2[4] + pdVar2[2] * pdVar2[2] + pdVar2[1] * pdVar2[1] + dVar13;
  if (dVar13 < 0.0) {
    dVar13 = sqrt(dVar13);
    uStack_30 = extraout_XMM0_Qb;
  }
  else {
    dVar13 = SQRT(dVar13);
    uStack_30 = 0;
  }
  local_38 = dVar13 * 1e-12;
  pdVar2 = (this->fData).super_TPZVec<double>.fStore;
  dVar13 = *pdVar2;
  if (ABS(dVar13) <= local_38) {
    uVar6 = 0xffffffffffffffff;
    do {
      if (uVar6 == 4) goto LAB_00d77e88;
      lVar10 = uVar6 + 2;
      uVar6 = uVar6 + 1;
    } while (ABS(pdVar2[lVar10]) <= local_38);
    if (4 < uVar6) {
LAB_00d77e88:
      eigensystem->fDistinctEigenvalues = 1;
      pdVar2 = (eigensystem->fEigenvalues).super_TPZVec<double>.fStore;
      *pdVar2 = 0.0;
      pdVar2[1] = 0.0;
      pdVar2[2] = 0.0;
      puVar11 = (eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore;
      puVar11[0] = 3;
      puVar11[1] = 3;
      puVar11[2] = 3;
      if (!compute_eigenvectors) {
        return;
      }
      local_40 = 0.0;
      TPZManVector<double,_3>::TPZManVector((TPZManVector<double,_3> *)local_78,3,&local_40);
      TPZManVector<double,_3>::operator=
                ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore,
                 (TPZManVector<double,_3> *)local_78);
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)local_78);
      *(((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore)->
       super_TPZVec<double>).fStore = 1.0;
      local_40 = 0.0;
      TPZManVector<double,_3>::TPZManVector((TPZManVector<double,_3> *)local_78,3,&local_40);
      TPZManVector<double,_3>::operator=
                ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore + 1,
                 (TPZManVector<double,_3> *)local_78);
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)local_78);
      (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore[1].
      super_TPZVec<double>.fStore[1] = 1.0;
      local_40 = 0.0;
      TPZManVector<double,_3>::TPZManVector((TPZManVector<double,_3> *)local_78,3,&local_40);
      TPZManVector<double,_3>::operator=
                ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore + 2,
                 (TPZManVector<double,_3> *)local_78);
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)local_78);
      (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore[2].
      super_TPZVec<double>.fStore[2] = 1.0;
      return;
    }
  }
  if (((local_38 < ABS(pdVar2[1])) || (local_38 < ABS(pdVar2[2]))) || (local_38 < ABS(pdVar2[4]))) {
    DirectEigenValues(this,eigensystem,compute_eigenvectors);
    pdVar2 = (eigensystem->fEigenvalues).super_TPZVec<double>.fStore;
    auVar14._8_8_ = -(ulong)(ABS(pdVar2[1] - pdVar2[2]) <= local_38);
    auVar14._0_8_ = -(ulong)(ABS(*pdVar2 - pdVar2[1]) <= local_38);
    uVar5 = movmskpd((int)pdVar2,auVar14);
    if (uVar5 != 3) {
      bVar9 = (byte)uVar5;
      if (((bVar9 >> 1 | bVar9) & 1) != 0) {
        eigensystem->fDistinctEigenvalues = 2;
        puVar11 = (eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore;
        puVar11[1] = 2;
        puVar11[(ulong)((byte)~bVar9 & 1) * 2] = 2;
        puVar11[(ulong)(uVar5 & 1) * 2] = 1;
        return;
      }
      eigensystem->fDistinctEigenvalues = 3;
      puVar11 = (eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore;
      puVar11[0] = 1;
      puVar11[1] = 1;
      puVar11[2] = 1;
      return;
    }
LAB_00d77e33:
    eigensystem->fDistinctEigenvalues = 1;
    puVar11 = (eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore;
    puVar11[0] = 3;
    puVar11[1] = 3;
    puVar11[2] = 3;
    return;
  }
  pdVar7 = (eigensystem->fEigenvalues).super_TPZVec<double>.fStore;
  *pdVar7 = dVar13;
  dVar16 = pdVar2[3];
  pdVar7[1] = dVar16;
  dVar15 = pdVar2[5];
  pdVar7[2] = dVar15;
  if (compute_eigenvectors) {
    (*(eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>._vptr_TPZVec[4])
              (&eigensystem->fEigenvectors,3);
    local_40 = 0.0;
    TPZManVector<double,_3>::TPZManVector((TPZManVector<double,_3> *)local_78,3,&local_40);
    TPZManVector<double,_3>::operator=
              ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore,
               (TPZManVector<double,_3> *)local_78);
    TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)local_78);
    *(((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore)->
     super_TPZVec<double>).fStore = 1.0;
    local_40 = 0.0;
    TPZManVector<double,_3>::TPZManVector((TPZManVector<double,_3> *)local_78,3,&local_40);
    TPZManVector<double,_3>::operator=
              ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore + 1,
               (TPZManVector<double,_3> *)local_78);
    TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)local_78);
    (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore[1].
    super_TPZVec<double>.fStore[1] = 1.0;
    local_40 = 0.0;
    TPZManVector<double,_3>::TPZManVector((TPZManVector<double,_3> *)local_78,3,&local_40);
    TPZManVector<double,_3>::operator=
              ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore + 2,
               (TPZManVector<double,_3> *)local_78);
    TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)local_78);
    (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore[2].
    super_TPZVec<double>.fStore[2] = 1.0;
    pdVar7 = (eigensystem->fEigenvalues).super_TPZVec<double>.fStore;
    dVar13 = *pdVar7;
    dVar16 = pdVar7[1];
    dVar15 = pdVar7[2];
  }
  dVar17 = ABS(dVar13 - dVar16);
  dVar18 = ABS(dVar16 - dVar15);
  if ((dVar17 <= local_38) && (dVar18 <= local_38)) goto LAB_00d77e33;
  if ((dVar17 <= local_38) || ((dVar18 <= local_38 || (ABS(dVar13 - dVar15) <= local_38)))) {
    uVar6 = (ulong)(local_38 < dVar18);
    bVar4 = local_38 < dVar17;
    eigensystem->fDistinctEigenvalues = 2;
    if (!bVar4) {
      uVar6 = 2;
    }
    puVar11 = (eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore;
    puVar11[uVar6] = 1;
    puVar11[bVar4 && local_38 >= dVar18] = 2;
    puVar11[bVar4 + 1] = 2;
  }
  else {
    eigensystem->fDistinctEigenvalues = 3;
    puVar11 = (eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore;
    puVar11[0] = 1;
    puVar11[1] = 1;
    puVar11[2] = 1;
  }
  if (dVar13 < dVar16) {
    *pdVar7 = dVar16;
    pdVar7[1] = dVar13;
    *(ulong *)puVar11 =
         CONCAT44((int)*(undefined8 *)puVar11,(int)((ulong)*(undefined8 *)puVar11 >> 0x20));
    dVar16 = dVar13;
    if (compute_eigenvectors) {
      pTVar3 = (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore;
      local_70 = ZEXT816(0);
      local_60 = 0;
      local_78 = (undefined1  [8])&PTR__TPZManVector_01819f98;
      uVar6 = (pTVar3->super_TPZVec<double>).fNElements;
      if ((long)uVar6 < 4) {
        puVar8 = local_58;
        local_70._8_8_ = uVar6;
        local_70._0_8_ = puVar8;
        if (0 < (long)uVar6) goto LAB_00d7824a;
      }
      else {
        puVar8 = (undefined1 *)operator_new__(-(ulong)(uVar6 >> 0x3d != 0) | uVar6 * 8);
        local_70._8_8_ = uVar6;
        local_70._0_8_ = puVar8;
        local_60 = uVar6;
LAB_00d7824a:
        pdVar2 = (pTVar3->super_TPZVec<double>).fStore;
        uVar12 = 0;
        do {
          *(double *)(puVar8 + uVar12 * 8) = pdVar2[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar6 != uVar12);
      }
      TPZManVector<double,_3>::operator=(pTVar3,pTVar3 + 1);
      TPZManVector<double,_3>::operator=
                ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore + 1,
                 (TPZManVector<double,_3> *)local_78);
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)local_78);
      pdVar7 = (eigensystem->fEigenvalues).super_TPZVec<double>.fStore;
      dVar16 = pdVar7[1];
      dVar15 = pdVar7[2];
    }
  }
  if (dVar16 < dVar15) {
    pdVar7[1] = dVar15;
    pdVar7[2] = dVar16;
    puVar11 = (eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore;
    uVar1 = *(undefined8 *)(puVar11 + 1);
    *(ulong *)(puVar11 + 1) = CONCAT44((int)uVar1,(int)((ulong)uVar1 >> 0x20));
    dVar16 = dVar15;
    if (compute_eigenvectors) {
      pTVar3 = (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore;
      local_70 = (undefined1  [16])0x0;
      local_60 = 0;
      local_78 = (undefined1  [8])&PTR__TPZManVector_01819f98;
      uVar6 = pTVar3[1].super_TPZVec<double>.fNElements;
      if ((long)uVar6 < 4) {
        puVar8 = local_58;
        local_70._8_8_ = uVar6;
        local_70._0_8_ = puVar8;
        if (0 < (long)uVar6) goto LAB_00d7833c;
      }
      else {
        puVar8 = (undefined1 *)operator_new__(-(ulong)(uVar6 >> 0x3d != 0) | uVar6 * 8);
        local_70._8_8_ = uVar6;
        local_70._0_8_ = puVar8;
        local_60 = uVar6;
LAB_00d7833c:
        pdVar2 = pTVar3[1].super_TPZVec<double>.fStore;
        uVar12 = 0;
        do {
          *(double *)(puVar8 + uVar12 * 8) = pdVar2[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar6 != uVar12);
      }
      TPZManVector<double,_3>::operator=(pTVar3 + 1,pTVar3 + 2);
      TPZManVector<double,_3>::operator=
                ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore + 2,
                 (TPZManVector<double,_3> *)local_78);
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)local_78);
      pdVar7 = (eigensystem->fEigenvalues).super_TPZVec<double>.fStore;
      dVar16 = pdVar7[1];
    }
  }
  dVar13 = *pdVar7;
  if (dVar16 <= dVar13) {
    return;
  }
  *pdVar7 = dVar16;
  pdVar7[1] = dVar13;
  puVar11 = (eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore;
  uVar1 = *(undefined8 *)puVar11;
  *(ulong *)puVar11 = CONCAT44((int)uVar1,(int)((ulong)uVar1 >> 0x20));
  if (!compute_eigenvectors) {
    return;
  }
  pTVar3 = (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore;
  local_70 = (undefined1  [16])0x0;
  local_60 = 0;
  local_78 = (undefined1  [8])&PTR__TPZManVector_01819f98;
  uVar6 = (pTVar3->super_TPZVec<double>).fNElements;
  if ((long)uVar6 < 4) {
    puVar8 = local_58;
    local_70._8_8_ = uVar6;
    local_70._0_8_ = puVar8;
    if ((long)uVar6 < 1) goto LAB_00d7843f;
  }
  else {
    puVar8 = (undefined1 *)operator_new__(-(ulong)(uVar6 >> 0x3d != 0) | uVar6 * 8);
    local_70._8_8_ = uVar6;
    local_70._0_8_ = puVar8;
    local_60 = uVar6;
  }
  pdVar2 = (pTVar3->super_TPZVec<double>).fStore;
  uVar12 = 0;
  do {
    *(double *)(puVar8 + uVar12 * 8) = pdVar2[uVar12];
    uVar12 = uVar12 + 1;
  } while (uVar6 != uVar12);
LAB_00d7843f:
  TPZManVector<double,_3>::operator=(pTVar3,pTVar3 + 1);
  TPZManVector<double,_3>::operator=
            ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore + 1,
             (TPZManVector<double,_3> *)local_78);
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)local_78);
  return;
}

Assistant:

void TPZTensor<T>::ComputeEigenvalues(TPZDecomposed &eigensystem, const bool compute_eigenvectors) const {
    TPZManVector<T, 3> &eigenvalues = eigensystem.fEigenvalues;
    TPZManVector<TPZManVector<T, 3>, 3> &eigenvectors = eigensystem.fEigenvectors;

    T tol = Norm()*1.e-12;

    if (this->IsZeroTensor(tol)) {
        eigensystem.fDistinctEigenvalues = 1;
        eigenvalues[0] = eigenvalues[1] = eigenvalues[2] = 0.;
        eigensystem.fGeometricMultiplicity[0] = 3;
        eigensystem.fGeometricMultiplicity[1] = 3;
        eigensystem.fGeometricMultiplicity[2] = 3;
        if (compute_eigenvectors) {
            eigenvectors[0] = TPZManVector<T, 3>(3, 0.);
            eigenvectors[0][0] = 1.0;
            eigenvectors[1] = TPZManVector<T, 3>(3, 0.);
            eigenvectors[1][1] = 1.0;
            eigenvectors[2] = TPZManVector<T, 3>(3, 0.);
            eigenvectors[2][2] = 1.0;
        }
    } else if (this->IsDiagonal(tol)) {
        eigenvalues[0] = this->XX();
        eigenvalues[1] = this->YY();
        eigenvalues[2] = this->ZZ();

        if (compute_eigenvectors) {
            eigenvectors.resize(3);
            eigenvectors[0] = TPZManVector<T, 3>(3, 0.);
            eigenvectors[0][0] = 1.0;
            eigenvectors[1] = TPZManVector<T, 3>(3, 0.);
            eigenvectors[1][1] = 1.0;
            eigenvectors[2] = TPZManVector<T, 3>(3, 0.);
            eigenvectors[2][2] = 1.0;
        }

        bool ev0eqev1 = AreEqual(eigenvalues[0], eigenvalues[1], tol);
        bool ev1eqev2 = AreEqual(eigenvalues[1], eigenvalues[2], tol);

        if (ev0eqev1 && ev1eqev2) {
            //tres autovalores iguais
            eigensystem.fDistinctEigenvalues = 1;
            eigensystem.fGeometricMultiplicity[0] = 3;
            eigensystem.fGeometricMultiplicity[1] = 3;
            eigensystem.fGeometricMultiplicity[2] = 3;
            return;
        } else if (ev0eqev1 || ev1eqev2 || AreEqual(eigenvalues[0], eigenvalues[2], tol)) {
            eigensystem.fDistinctEigenvalues = 2;
            int different = -1;
            int equals[2] = {-1, -1};
            if (ev0eqev1) {
                different = 2;
                equals[0] = 0;
                equals[1] = 1;
            } else if (ev1eqev2) {
                different = 0;
                equals[0] = 1;
                equals[1] = 2;
            } else {
                different = 1;
                equals[0] = 0;
                equals[1] = 2;
            }
            eigensystem.fGeometricMultiplicity[different] = 1;
            eigensystem.fGeometricMultiplicity[equals[0]] = 2;
            eigensystem.fGeometricMultiplicity[equals[1]] = 2;
        } else {
            eigensystem.fDistinctEigenvalues = 3;
            eigensystem.fGeometricMultiplicity[0] = 1;
            eigensystem.fGeometricMultiplicity[1] = 1;
            eigensystem.fGeometricMultiplicity[2] = 1;
        }

        if (eigenvalues[0] < eigenvalues[1]) {
            T eigenvalueTemp = eigenvalues[0];
            eigenvalues[0] = eigenvalues[1];
            eigenvalues[1] = eigenvalueTemp;
            std::swap(eigensystem.fGeometricMultiplicity[0], eigensystem.fGeometricMultiplicity[1]);
            if (compute_eigenvectors) {
                auto temp = eigenvectors[0];
                eigenvectors[0] = eigenvectors[1];
                eigenvectors[1] = temp;
            }
        }
        if (eigenvalues[1] < eigenvalues[2]) {
            T eigenvalueTemp = eigenvalues[1];
            eigenvalues[1] = eigenvalues[2];
            eigenvalues[2] = eigenvalueTemp;
            std::swap(eigensystem.fGeometricMultiplicity[1], eigensystem.fGeometricMultiplicity[2]);
            if (compute_eigenvectors) {
                auto temp = eigenvectors[1];
                eigenvectors[1] = eigenvectors[2];
                eigenvectors[2] = temp;
            }
        }
        if (eigenvalues[0] < eigenvalues[1]) {
            T eigenvalueTemp = eigenvalues[0];
            eigenvalues[0] = eigenvalues[1];
            eigenvalues[1] = eigenvalueTemp;
            std::swap(eigensystem.fGeometricMultiplicity[0], eigensystem.fGeometricMultiplicity[1]);
            if (compute_eigenvectors) {
                auto temp = eigenvectors[0];
                eigenvectors[0] = eigenvectors[1];
                eigenvectors[1] = temp;
            }
        }
    } else {
        this->DirectEigenValues(eigensystem, compute_eigenvectors);

        bool ev0eqev1 = AreEqual(eigenvalues[0], eigenvalues[1], tol);
        bool ev1eqev2 = AreEqual(eigenvalues[1], eigenvalues[2], tol);
        //tres autovalores iguais
        if (ev0eqev1 && ev1eqev2) {
            eigensystem.fDistinctEigenvalues = 1;
            eigensystem.fGeometricMultiplicity[0] = 3;
            eigensystem.fGeometricMultiplicity[1] = 3;
            eigensystem.fGeometricMultiplicity[2] = 3;
        } else if (ev0eqev1 || ev1eqev2) {
            //dois autovalores iguais
            eigensystem.fDistinctEigenvalues = 2;

            int different = -1;
            int equals = -1;
            if (ev0eqev1) {
                different = 2;
                equals = 0;
            } else {
                different = 0;
                equals = 2;
            }
            eigensystem.fGeometricMultiplicity[1] = 2;
            eigensystem.fGeometricMultiplicity[equals] = 2;
            eigensystem.fGeometricMultiplicity[different] = 1;
        } else {
            //3 autovalores diferentes
            eigensystem.fDistinctEigenvalues = 3;
            eigensystem.fGeometricMultiplicity[0] = 1;
            eigensystem.fGeometricMultiplicity[1] = 1;
            eigensystem.fGeometricMultiplicity[2] = 1;
        }
    }
}